

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

field * __thiscall field::printPile_abi_cxx11_(field *this)

{
  bool bVar1;
  long in_RSI;
  undefined1 local_80 [64];
  reference local_40;
  card *card;
  iterator __end1;
  iterator __begin1;
  vector<card,_std::allocator<card>_> *__range1;
  field *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)this);
  __end1 = std::vector<card,_std::allocator<card>_>::begin
                     ((vector<card,_std::allocator<card>_> *)(in_RSI + 8));
  card = (card *)std::vector<card,_std::allocator<card>_>::end
                           ((vector<card,_std::allocator<card>_> *)(in_RSI + 8));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>
                                     *)&card), bVar1) {
    local_40 = __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::
               operator*(&__end1);
    ::card::getName_abi_cxx11_((card *)local_80);
    std::operator+(local_80 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10f13d);
    std::__cxx11::string::operator+=((string *)this,(string *)(local_80 + 0x20));
    std::__cxx11::string::~string((string *)(local_80 + 0x20));
    std::__cxx11::string::~string((string *)local_80);
    bVar1 = ::card::getBolted(local_40);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)this,"(bolted)");
    }
    std::__cxx11::string::operator+=((string *)this,"] ");
    __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::operator++
              (&__end1);
  }
  return this;
}

Assistant:

string field::printPile() {
    string output;
    for(auto &card : field_) {
        output += "[" + card.getName();
        if (card.getBolted()) output += "(bolted)";
        output += "] ";
    }

    return output;
}